

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * printfTempBuf(sqlite3_str *pAccum,sqlite3_int64 n)

{
  char *pcVar1;
  
  if (pAccum->accError == '\0') {
    if ((n <= (long)(ulong)pAccum->nAlloc) || (n <= (long)(ulong)pAccum->mxAlloc)) {
      if (pAccum->db == (sqlite3 *)0x0) {
        pcVar1 = (char *)sqlite3Malloc(n);
      }
      else {
        pcVar1 = (char *)sqlite3DbMallocRawNN(pAccum->db,n);
      }
      if (pcVar1 != (char *)0x0) {
        return pcVar1;
      }
      pAccum->accError = '\a';
      if (pAccum->mxAlloc == 0) {
        return (char *)0x0;
      }
      sqlite3_str_reset(pAccum);
      return (char *)0x0;
    }
    sqlite3StrAccumSetError(pAccum,'\x12');
  }
  return (char *)0x0;
}

Assistant:

static char *printfTempBuf(sqlite3_str *pAccum, sqlite3_int64 n){
  char *z;
  if( pAccum->accError ) return 0;
  if( n>pAccum->nAlloc && n>pAccum->mxAlloc ){
    sqlite3StrAccumSetError(pAccum, SQLITE_TOOBIG);
    return 0;
  }
  z = sqlite3DbMallocRaw(pAccum->db, n);
  if( z==0 ){
    sqlite3StrAccumSetError(pAccum, SQLITE_NOMEM);
  }
  return z;
}